

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O2

void Q_SetEntry(QMatrix *Q,size_t RoC,size_t Entry,size_t Pos,Real Val)

{
  ElType *pEVar1;
  LASErrIdType LVar2;
  
  LVar2 = LASResult();
  if (LVar2 == LASOK) {
    if (((RoC == 0) || (Q->Dim <= Pos - 1 || Q->Dim < RoC)) || (Q->Len[RoC] <= Entry)) {
      LASError(LASRangeErr,"Q_SetEntry",Q->Name,(char *)0x0,(char *)0x0);
      return;
    }
    pEVar1 = Q->El[RoC];
    pEVar1[Entry].Pos = Pos;
    pEVar1[Entry].Val = Val;
  }
  return;
}

Assistant:

void Q_SetEntry(QMatrix *Q, size_t RoC, size_t Entry, size_t Pos, Real Val)
/* set a new matrix entry */
{
    if (LASResult() == LASOK) {
        if ((RoC > 0 && RoC <= Q->Dim && Pos > 0 && Pos <= Q->Dim) &&
            (Entry < Q->Len[RoC])) {
            Q->El[RoC][Entry].Pos = Pos;
            Q->El[RoC][Entry].Val = Val;
        } else {
            LASError(LASRangeErr, "Q_SetEntry", Q->Name, NULL, NULL);
        }
    }
}